

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterResult __thiscall duckdb::FilterCombiner::AddFilter(FilterCombiner *this,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ExpressionClass EVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FilterResult FVar6;
  FilterResult FVar7;
  BoundBetweenExpression *pBVar8;
  pointer pEVar9;
  type expr_00;
  Expression *expr_01;
  idx_t iVar10;
  _Base_ptr p_Var11;
  BoundComparisonExpression *this_01;
  _Base_ptr p_Var12;
  type pBVar13;
  byte bVar14;
  FilterCombiner *pFVar15;
  _Base_ptr p_Var16;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> right;
  templated_unique_single_t lower_comp;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> left;
  Value result;
  Value constant_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1c8;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_1c0;
  LogicalType local_1b8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_1a0;
  ExpressionValueInformation local_198;
  Value local_150;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_110;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  undefined1 local_c0 [72];
  ExpressionType local_38;
  
  iVar4 = (*(expr->super_BaseExpression)._vptr_BaseExpression[6])(expr);
  if ((char)iVar4 != '\0') {
    return UNSUPPORTED;
  }
  iVar4 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar4 != '\0') {
    LogicalType::LogicalType(&local_d8,SQLNULL);
    Value::Value(&local_198.constant,&local_d8);
    LogicalType::~LogicalType(&local_d8);
    bVar3 = ExpressionExecutor::TryEvaluateScalar(this->context,expr,&local_198.constant);
    FVar7 = UNSUPPORTED;
    if (bVar3) {
      LogicalType::LogicalType(&local_1b8,BOOLEAN);
      FVar7 = UNSATISFIABLE;
      Value::DefaultCastAs(&local_150,&local_198.constant,&local_1b8,false);
      Value::operator=(&local_198.constant,&local_150);
      Value::~Value(&local_150);
      LogicalType::~LogicalType(&local_1b8);
      if (local_198.constant.is_null == false) {
        bVar3 = BooleanValue::Get(&local_198.constant);
        FVar7 = (FilterResult)bVar3;
      }
    }
    Value::~Value(&local_198.constant);
    return FVar7;
  }
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == BOUND_COMPARISON) {
    FVar7 = AddBoundComparisonFilter(this,expr);
    return FVar7;
  }
  if (EVar1 != BOUND_BETWEEN) {
    return UNSUPPORTED;
  }
  pBVar8 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&expr->super_BaseExpression);
  this_00 = &pBVar8->lower;
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar4 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
  local_1a0 = &pBVar8->upper;
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (local_1a0);
  iVar5 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
  bVar14 = (byte)iVar4 | (byte)iVar5;
  FVar7 = UNSUPPORTED;
  if (bVar14 == 1) {
    this_02 = &pBVar8->input;
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this_02);
    expr_01 = GetNode(this,expr_00);
    iVar10 = GetEquivalenceSet(this,expr_01);
    if ((byte)iVar4 == 0) {
      bVar3 = pBVar8->upper_inclusive;
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1b8,pEVar9);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_02);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1c8,pEVar9);
      this_01 = (BoundComparisonExpression *)operator_new(0x68);
      local_198.constant.type_.id_ = local_1b8.id_;
      local_198.constant.type_.physical_type_ = local_1b8.physical_type_;
      local_198.constant.type_._2_6_ = local_1b8._2_6_;
      local_1b8._0_8_ =
           (__uniq_ptr_data<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true,_true>
            )0x0;
      local_150.type_._0_8_ = local_1c8._M_head_impl;
      local_1c8._M_head_impl = (Expression *)0x0;
      BoundComparisonExpression::BoundComparisonExpression
                (this_01,bVar3 * '\x02' + COMPARE_LESSTHAN,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_198,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_150);
      local_1c0._M_head_impl = this_01;
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_150.type_._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_150.type_._0_8_ + 8))();
      }
      local_150.type_._0_8_ =
           (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      if ((Expression *)local_198.constant.type_._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_198.constant.type_._0_8_ + 8))();
      }
      pBVar13 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                ::operator*((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                             *)&local_1c0);
      FVar6 = AddBoundComparisonFilter(this,&pBVar13->super_Expression);
      if (local_1c0._M_head_impl != (BoundComparisonExpression *)0x0) {
        (*((local_1c0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      if (local_1c8._M_head_impl != (Expression *)0x0) {
        (*((local_1c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if ((_Tuple_impl<0UL,_duckdb::BoundComparisonExpression_*,_std::default_delete<duckdb::BoundComparisonExpression>_>
           )local_1b8._0_8_ != (BoundComparisonExpression *)0x0) {
        (**(code **)(*(long *)local_1b8._0_8_ + 8))();
      }
    }
    else {
      _Var2._M_head_impl =
           (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      local_110 = this_02;
      LogicalType::LogicalType(&local_f0,SQLNULL);
      Value::Value(&local_150,&local_f0);
      LogicalType::~LogicalType(&local_f0);
      bVar3 = ExpressionExecutor::TryEvaluateScalar(this->context,_Var2._M_head_impl,&local_150);
      FVar6 = UNSATISFIABLE;
      if (bVar3) {
        ExpressionValueInformation::ExpressionValueInformation(&local_198);
        local_198.comparison_type = pBVar8->lower_inclusive * '\x02' | COMPARE_GREATERTHAN;
        Value::operator=(&local_198.constant,&local_150);
        p_Var16 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var11 = p_Var16;
        for (p_Var12 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent; p_Var12 != (_Base_ptr)0x0;
            p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < iVar10]) {
          if (*(ulong *)(p_Var12 + 1) >= iVar10) {
            p_Var11 = p_Var12;
          }
        }
        if ((p_Var11 != p_Var16) && (*(ulong *)(p_Var11 + 1) <= iVar10)) {
          p_Var16 = p_Var11;
        }
        pFVar15 = (FilterCombiner *)&stack0xffffffffffffff88;
        Value::Value((Value *)pFVar15,&local_198.constant);
        local_38 = local_198.comparison_type;
        FVar6 = AddConstantComparison
                          (pFVar15,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                    *)&p_Var16[1]._M_parent,
                           (ExpressionValueInformation *)&stack0xffffffffffffff88);
        Value::~Value((Value *)&stack0xffffffffffffff88);
        Value::~Value(&local_198.constant);
      }
      Value::~Value(&local_150);
      FVar7 = UNSUPPORTED;
      this_02 = local_110;
      if (!bVar3) goto LAB_01182879;
    }
    FVar7 = FVar6;
    if (FVar6 == SUCCESS) {
      if ((byte)iVar5 == 0) {
        local_1c8._M_head_impl._0_1_ = pBVar8->upper_inclusive * '\x02' + '\x1b';
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_02);
        (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_198,pEVar9);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(local_1a0);
        (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_150,pEVar9);
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&local_1b8,(ExpressionType *)&local_1c8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_198,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_150);
        pBVar13 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                  ::operator*((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                               *)&local_1b8);
        FVar7 = AddBoundComparisonFilter(this,&pBVar13->super_Expression);
        if ((BoundComparisonExpression *)local_1b8._0_8_ != (BoundComparisonExpression *)0x0) {
          (**(code **)(*(long *)local_1b8._0_8_ + 8))();
        }
        if ((Expression *)local_150.type_._0_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_150.type_._0_8_ + 8))();
        }
        if ((Expression *)local_198.constant.type_._0_8_ != (Expression *)0x0) {
          (**(code **)(*(long *)local_198.constant.type_._0_8_ + 8))();
        }
      }
      else {
        _Var2._M_head_impl =
             (local_1a0->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        LogicalType::LogicalType(&local_108,SQLNULL);
        Value::Value(&local_150,&local_108);
        LogicalType::~LogicalType(&local_108);
        bVar3 = ExpressionExecutor::TryEvaluateScalar(this->context,_Var2._M_head_impl,&local_150);
        FVar7 = UNSUPPORTED;
        if (bVar3) {
          ExpressionValueInformation::ExpressionValueInformation(&local_198);
          local_198.comparison_type = pBVar8->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
          Value::operator=(&local_198.constant,&local_150);
          p_Var11 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var12 = p_Var11;
          for (p_Var16 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent; p_Var16 != (_Base_ptr)0x0;
              p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < iVar10]) {
            if (*(ulong *)(p_Var16 + 1) >= iVar10) {
              p_Var12 = p_Var16;
            }
          }
          if ((p_Var12 != p_Var11) && (*(ulong *)(p_Var12 + 1) <= iVar10)) {
            p_Var11 = p_Var12;
          }
          pFVar15 = (FilterCombiner *)local_c0;
          Value::Value((Value *)pFVar15,&local_198.constant);
          local_c0[0x40] = local_198.comparison_type;
          FVar7 = AddConstantComparison
                            (pFVar15,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                      *)&p_Var11[1]._M_parent,(ExpressionValueInformation *)local_c0
                            );
          Value::~Value((Value *)local_c0);
          Value::~Value(&local_198.constant);
        }
        Value::~Value(&local_150);
      }
    }
  }
LAB_01182879:
  if (bVar14 == 0) {
    return UNSUPPORTED;
  }
  return FVar7;
}

Assistant:

FilterResult FilterCombiner::AddFilter(Expression &expr) {
	if (expr.HasParameter()) {
		return FilterResult::UNSUPPORTED;
	}
	if (expr.IsFoldable()) {
		// scalar condition, evaluate it
		Value result;
		if (!ExpressionExecutor::TryEvaluateScalar(context, expr, result)) {
			return FilterResult::UNSUPPORTED;
		}
		result = result.DefaultCastAs(LogicalType::BOOLEAN);
		// check if the filter passes
		if (result.IsNull() || !BooleanValue::Get(result)) {
			// the filter does not pass the scalar test, create an empty result
			return FilterResult::UNSATISFIABLE;
		} else {
			// the filter passes the scalar test, just remove the condition
			return FilterResult::SUCCESS;
		}
	}
	D_ASSERT(!expr.IsFoldable());
	if (expr.GetExpressionClass() == ExpressionClass::BOUND_BETWEEN) {
		auto &comparison = expr.Cast<BoundBetweenExpression>();
		//! check if one of the sides is a scalar value
		bool lower_is_scalar = comparison.lower->IsFoldable();
		bool upper_is_scalar = comparison.upper->IsFoldable();
		if (lower_is_scalar || upper_is_scalar) {
			//! comparison with scalar - break apart
			auto &node = GetNode(*comparison.input);
			idx_t equivalence_set = GetEquivalenceSet(node);
			auto result = FilterResult::UNSATISFIABLE;

			if (lower_is_scalar) {
				auto scalar = comparison.lower.get();
				Value constant_value;
				if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
					return FilterResult::UNSUPPORTED;
				}

				// create the ExpressionValueInformation
				ExpressionValueInformation info;
				if (comparison.lower_inclusive) {
					info.comparison_type = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
				} else {
					info.comparison_type = ExpressionType::COMPARE_GREATERTHAN;
				}
				info.constant = constant_value;

				// get the current bucket of constant values
				D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
				auto &info_list = constant_values.find(equivalence_set)->second;
				// check the existing constant comparisons to see if we can do any pruning
				result = AddConstantComparison(info_list, info);
			} else {
				D_ASSERT(upper_is_scalar);
				const auto type = comparison.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO
				                                             : ExpressionType::COMPARE_LESSTHAN;
				auto left = comparison.lower->Copy();
				auto right = comparison.input->Copy();
				auto lower_comp = make_uniq<BoundComparisonExpression>(type, std::move(left), std::move(right));
				result = AddBoundComparisonFilter(*lower_comp);
			}

			//	 Stop if we failed
			if (result != FilterResult::SUCCESS) {
				return result;
			}

			if (upper_is_scalar) {
				auto scalar = comparison.upper.get();
				Value constant_value;
				if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
					return FilterResult::UNSUPPORTED;
				}

				// create the ExpressionValueInformation
				ExpressionValueInformation info;
				if (comparison.upper_inclusive) {
					info.comparison_type = ExpressionType::COMPARE_LESSTHANOREQUALTO;
				} else {
					info.comparison_type = ExpressionType::COMPARE_LESSTHAN;
				}
				info.constant = constant_value;

				// get the current bucket of constant values
				D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
				// check the existing constant comparisons to see if we can do any pruning
				result = AddConstantComparison(constant_values.find(equivalence_set)->second, info);
			} else {
				D_ASSERT(lower_is_scalar);
				const auto type = comparison.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO
				                                             : ExpressionType::COMPARE_LESSTHAN;
				auto left = comparison.input->Copy();
				auto right = comparison.upper->Copy();
				auto upper_comp = make_uniq<BoundComparisonExpression>(type, std::move(left), std::move(right));
				result = AddBoundComparisonFilter(*upper_comp);
			}

			return result;
		}
	} else if (expr.GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
		return AddBoundComparisonFilter(expr);
	}
	// only comparisons supported for now
	return FilterResult::UNSUPPORTED;
}